

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O2

void __thiscall
S2CrossingEdgeQuery::GetCrossingEdges
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,CrossingType type,
          vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_> *edges)

{
  uint uVar1;
  pointer pSVar2;
  pointer pSVar3;
  int iVar4;
  int edge_id;
  pointer pSVar5;
  Edge b;
  S2CopyingEdgeCrosser crosser;
  S2Point local_150;
  S2Point SStack_138;
  ShapeEdge local_120;
  S2CopyingEdgeCrosser local_e8;
  
  pSVar2 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((edges->super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
      _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    (edges->super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
    _M_impl.super__Vector_impl_data._M_finish = pSVar2;
  }
  GetCandidates(this,a0,a1,shape,&this->tmp_candidates_);
  S2CopyingEdgeCrosser::S2CopyingEdgeCrosser(&local_e8,a0,a1);
  pSVar3 = (this->tmp_candidates_).
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar5 = (this->tmp_candidates_).
                super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar3; pSVar5 = pSVar5 + 1) {
    uVar1 = pSVar5->edge_id;
    (*shape->_vptr_S2Shape[3])(&local_150,shape,(ulong)uVar1);
    iVar4 = S2CopyingEdgeCrosser::CrossingSign(&local_e8,&local_150,&SStack_138);
    if ((int)(uint)(type != ALL) <= iVar4) {
      local_120.id_.shape_id = shape->id_;
      local_120.edge_.v1.c_[1] = SStack_138.c_[1];
      local_120.edge_.v1.c_[2] = SStack_138.c_[2];
      local_120.edge_.v0.c_[2] = local_150.c_[2];
      local_120.edge_.v1.c_[0] = SStack_138.c_[0];
      local_120.edge_.v0.c_[0] = local_150.c_[0];
      local_120.edge_.v0.c_[1] = local_150.c_[1];
      local_120.id_.edge_id = uVar1;
      std::vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>::
      emplace_back<s2shapeutil::ShapeEdge>(edges,&local_120);
    }
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCrossingEdges(
    const S2Point& a0, const S2Point& a1, const S2Shape& shape,
    CrossingType type, vector<ShapeEdge>* edges) {
  edges->clear();
  GetCandidates(a0, a1, shape, &tmp_candidates_);
  int min_sign = (type == CrossingType::ALL) ? 0 : 1;
  S2CopyingEdgeCrosser crosser(a0, a1);
  for (ShapeEdgeId candidate : tmp_candidates_) {
    int edge_id = candidate.edge_id;
    S2Shape::Edge b = shape.edge(edge_id);
    if (crosser.CrossingSign(b.v0, b.v1) >= min_sign) {
      edges->push_back(ShapeEdge(shape.id(), edge_id, b));
    }
  }
}